

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

TimeProcessingResult __thiscall
helics::TimeCoordinator::processTimeBlockMessage(TimeCoordinator *this,ActionMessage *cmd)

{
  long lVar1;
  Time TVar2;
  int32_t blockId;
  
  TVar2.internalTimeCode = 0x7fffffffffffffff;
  switch(cmd->messageAction) {
  case cmd_time_block:
  case cmd_time_barrier:
    blockId = cmd->messageID;
    TVar2.internalTimeCode = (cmd->actionTime).internalTimeCode;
    break;
  case cmd_time_unblock:
  case cmd_time_barrier_clear:
    if ((this->timeBlocks).
        super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->timeBlocks).
        super__Vector_base<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) goto switchD_002dc4e2_caseD_2a;
    blockId = cmd->messageID;
    TVar2.internalTimeCode = 0x7fffffffffffffff;
    break;
  default:
    goto switchD_002dc4e2_caseD_2a;
  }
  TVar2 = updateTimeBlocks(this,blockId,TVar2);
switchD_002dc4e2_caseD_2a:
  lVar1 = (this->time_block).internalTimeCode;
  (this->time_block).internalTimeCode = TVar2.internalTimeCode;
  return lVar1 < TVar2.internalTimeCode;
}

Assistant:

TimeProcessingResult TimeCoordinator::processTimeBlockMessage(const ActionMessage& cmd)
{
    Time ltime = Time::maxVal();
    switch (cmd.action()) {
        case CMD_TIME_BLOCK:
        case CMD_TIME_BARRIER:
            ltime = updateTimeBlocks(cmd.messageID, cmd.actionTime);
            break;
        case CMD_TIME_UNBLOCK:
        case CMD_TIME_BARRIER_CLEAR:
            if (!timeBlocks.empty()) {
                ltime = updateTimeBlocks(cmd.messageID, Time::maxVal());
            }
            break;
        default:
            break;
    }
    if (ltime > time_block) {
        time_block = ltime;
        return TimeProcessingResult::PROCESSED;
    }
    time_block = ltime;
    return TimeProcessingResult::NOT_PROCESSED;
}